

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLSLMaterialRenderer::OnUnsetMaterial(COpenGLSLMaterialRenderer *this)

{
  COpenGLCacheHandler *this_00;
  long in_RDI;
  COpenGLCacheHandler *cacheHandler;
  GLhandleARB prog;
  bool enable;
  COpenGLExtensionHandler *in_stack_fffffffffffffff0;
  
  prog = (GLhandleARB)((ulong)in_RDI >> 0x20);
  if (*(int *)(in_RDI + 0x24) != 0) {
    COpenGLExtensionHandler::extGlUseProgramObject(in_stack_fffffffffffffff0,prog);
  }
  if (*(int *)(in_RDI + 0x28) != 0) {
    COpenGLExtensionHandler::irrGlUseProgram(in_stack_fffffffffffffff0,prog);
  }
  this_00 = COpenGLDriver::getCacheHandler(*(COpenGLDriver **)(in_RDI + 0x10));
  enable = SUB81((ulong)in_RDI >> 0x38,0);
  if (((*(byte *)(in_RDI + 0x20) & 1) != 0) || ((*(byte *)(in_RDI + 0x21) & 1) != 0)) {
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setBlend(&this_00->
                super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               ,enable);
  }
  if (((*(byte *)(in_RDI + 0x20) & 1) != 0) || ((*(byte *)(in_RDI + 0x22) & 1) != 0)) {
    COpenGLCacheHandler::setAlphaTest(this_00,enable);
  }
  return;
}

Assistant:

void COpenGLSLMaterialRenderer::OnUnsetMaterial()
{
	if (Program)
		Driver->extGlUseProgramObject(0);
	if (Program2)
		Driver->irrGlUseProgram(0);

	COpenGLCacheHandler *cacheHandler = Driver->getCacheHandler();
	if (Alpha || Blending) {
		cacheHandler->setBlend(false);
	}
	if (Alpha || AlphaTest) {
		cacheHandler->setAlphaTest(false);
	}
}